

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::ConvolutionParameter::InternalSerializeWithCachedSizesToArray
          (ConvolutionParameter *this,bool deterministic,uint8 *target)

{
  Rep *pRVar1;
  FillerParameter *pFVar2;
  void *pvVar3;
  bool bVar4;
  LogMessage *pLVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  LogFinisher local_111;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar9 = (this->_has_bits_).has_bits_[0];
  if ((uVar9 & 4) != 0) {
    uVar10 = this->num_output_;
    *target = '\b';
    pbVar11 = target + 1;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar6;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar6;
    target = pbVar11 + 1;
  }
  if ((uVar9 >> 0xc & 1) != 0) {
    bVar4 = this->bias_term_;
    *target = 0x10;
    target[1] = bVar4;
    target = target + 2;
  }
  uVar10 = (this->pad_).current_size_;
  if (uVar10 != 0) {
    if ((this->pad_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<(&local_d8,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
    }
    pRVar1 = (this->pad_).rep_;
    uVar7 = 1;
    if (1 < (int)uVar10) {
      uVar7 = (ulong)uVar10;
    }
    uVar8 = 0;
    do {
      uVar10 = pRVar1->elements[uVar8];
      *target = 0x18;
      pbVar11 = target + 1;
      uVar6 = uVar10;
      if (0x7f < uVar10) {
        do {
          *pbVar11 = (byte)uVar10 | 0x80;
          uVar6 = uVar10 >> 7;
          pbVar11 = pbVar11 + 1;
          bVar4 = 0x3fff < uVar10;
          uVar10 = uVar6;
        } while (bVar4);
      }
      *pbVar11 = (byte)uVar6;
      target = pbVar11 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  uVar10 = (this->kernel_size_).current_size_;
  if (uVar10 != 0) {
    if ((this->kernel_size_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<(&local_a0,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    pRVar1 = (this->kernel_size_).rep_;
    uVar7 = 1;
    if (1 < (int)uVar10) {
      uVar7 = (ulong)uVar10;
    }
    uVar8 = 0;
    do {
      uVar10 = pRVar1->elements[uVar8];
      *target = 0x20;
      pbVar11 = target + 1;
      uVar6 = uVar10;
      if (0x7f < uVar10) {
        do {
          *pbVar11 = (byte)uVar10 | 0x80;
          uVar6 = uVar10 >> 7;
          pbVar11 = pbVar11 + 1;
          bVar4 = 0x3fff < uVar10;
          uVar10 = uVar6;
        } while (bVar4);
      }
      *pbVar11 = (byte)uVar6;
      target = pbVar11 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  if ((uVar9 >> 0xd & 1) != 0) {
    uVar10 = this->group_;
    *target = 0x28;
    pbVar11 = target + 1;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar6;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar6;
    target = pbVar11 + 1;
  }
  uVar10 = (this->stride_).current_size_;
  if (uVar10 != 0) {
    if ((this->stride_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    pRVar1 = (this->stride_).rep_;
    uVar7 = 1;
    if (1 < (int)uVar10) {
      uVar7 = (ulong)uVar10;
    }
    uVar8 = 0;
    do {
      uVar10 = pRVar1->elements[uVar8];
      *target = 0x30;
      pbVar11 = target + 1;
      uVar6 = uVar10;
      if (0x7f < uVar10) {
        do {
          *pbVar11 = (byte)uVar10 | 0x80;
          uVar6 = uVar10 >> 7;
          pbVar11 = pbVar11 + 1;
          bVar4 = 0x3fff < uVar10;
          uVar10 = uVar6;
        } while (bVar4);
      }
      *pbVar11 = (byte)uVar6;
      target = pbVar11 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  if ((uVar9 & 1) != 0) {
    pFVar2 = this->weight_filler_;
    *target = 0x3a;
    pbVar11 = target + 1;
    uVar10 = pFVar2->_cached_size_;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar6;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar6;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(pFVar2,false,pbVar11 + 1);
  }
  if ((uVar9 & 2) != 0) {
    pFVar2 = this->bias_filler_;
    *target = 0x42;
    pbVar11 = target + 1;
    uVar10 = pFVar2->_cached_size_;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar6;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar6;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(pFVar2,false,pbVar11 + 1);
  }
  if ((uVar9 & 8) != 0) {
    uVar10 = this->pad_h_;
    *target = 0x48;
    pbVar11 = target + 1;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar6;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar6;
    target = pbVar11 + 1;
  }
  if ((uVar9 & 0x10) != 0) {
    uVar10 = this->pad_w_;
    *target = 0x50;
    pbVar11 = target + 1;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar6;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar6;
    target = pbVar11 + 1;
  }
  if ((uVar9 & 0x20) != 0) {
    uVar10 = this->kernel_h_;
    *target = 0x58;
    pbVar11 = target + 1;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar6;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar6;
    target = pbVar11 + 1;
  }
  if ((uVar9 & 0x40) != 0) {
    uVar10 = this->kernel_w_;
    *target = 0x60;
    pbVar11 = target + 1;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar6;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar6;
    target = pbVar11 + 1;
  }
  if ((char)uVar9 < '\0') {
    uVar10 = this->stride_h_;
    *target = 0x68;
    pbVar11 = target + 1;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar6;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar6;
    target = pbVar11 + 1;
  }
  if ((uVar9 >> 8 & 1) != 0) {
    uVar10 = this->stride_w_;
    *target = 0x70;
    pbVar11 = target + 1;
    uVar6 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar6 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar10;
        uVar10 = uVar6;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar6;
    target = pbVar11 + 1;
  }
  if ((uVar9 >> 9 & 1) != 0) {
    uVar7 = (ulong)this->engine_;
    pbVar11 = target + 1;
    *target = 0x78;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar11 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar8;
    target = pbVar11 + 1;
  }
  if ((uVar9 >> 0xb & 1) != 0) {
    uVar7 = (ulong)this->axis_;
    pbVar11 = target + 2;
    target[0] = 0x80;
    target[1] = 1;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar11 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar4 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar4);
    }
    *pbVar11 = (byte)uVar8;
    target = pbVar11 + 1;
  }
  if ((uVar9 >> 10 & 1) != 0) {
    bVar4 = this->force_nd_im2col_;
    target[0] = 0x88;
    target[1] = 1;
    target[2] = bVar4;
    target = target + 3;
  }
  uVar9 = (this->dilation_).current_size_;
  if (uVar9 != 0) {
    if ((this->dilation_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<(&local_110,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=(&local_111,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    pRVar1 = (this->dilation_).rep_;
    uVar7 = 1;
    if (1 < (int)uVar9) {
      uVar7 = (ulong)uVar9;
    }
    uVar8 = 0;
    do {
      uVar9 = pRVar1->elements[uVar8];
      target[0] = 0x90;
      target[1] = 1;
      pbVar11 = target + 2;
      uVar10 = uVar9;
      if (0x7f < uVar9) {
        do {
          *pbVar11 = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          pbVar11 = pbVar11 + 1;
          bVar4 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar4);
      }
      *pbVar11 = (byte)uVar10;
      target = pbVar11 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* ConvolutionParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ConvolutionParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 num_output = 1;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1, this->num_output(), target);
  }

  // optional bool bias_term = 2 [default = true];
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->bias_term(), target);
  }

  // repeated uint32 pad = 3;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(3, this->pad_, target);

  // repeated uint32 kernel_size = 4;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(4, this->kernel_size_, target);

  // optional uint32 group = 5 [default = 1];
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5, this->group(), target);
  }

  // repeated uint32 stride = 6;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(6, this->stride_, target);

  // optional .caffe.FillerParameter weight_filler = 7;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, *this->weight_filler_, deterministic, target);
  }

  // optional .caffe.FillerParameter bias_filler = 8;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, *this->bias_filler_, deterministic, target);
  }

  // optional uint32 pad_h = 9 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9, this->pad_h(), target);
  }

  // optional uint32 pad_w = 10 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10, this->pad_w(), target);
  }

  // optional uint32 kernel_h = 11;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(11, this->kernel_h(), target);
  }

  // optional uint32 kernel_w = 12;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(12, this->kernel_w(), target);
  }

  // optional uint32 stride_h = 13;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(13, this->stride_h(), target);
  }

  // optional uint32 stride_w = 14;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(14, this->stride_w(), target);
  }

  // optional .caffe.ConvolutionParameter.Engine engine = 15 [default = DEFAULT];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      15, this->engine(), target);
  }

  // optional int32 axis = 16 [default = 1];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(16, this->axis(), target);
  }

  // optional bool force_nd_im2col = 17 [default = false];
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(17, this->force_nd_im2col(), target);
  }

  // repeated uint32 dilation = 18;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(18, this->dilation_, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ConvolutionParameter)
  return target;
}